

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

run_container_t * run_container_from_array(array_container_t *c)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  rle16_t *prVar4;
  uint uVar5;
  uint uVar6;
  run_container_t *prVar7;
  long lVar8;
  uint uVar9;
  int32_t size;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  
  if ((long)c->cardinality == 0) {
    size = 0;
  }
  else {
    lVar8 = 0;
    uVar10 = 0xfffffffe;
    size = 0;
    do {
      uVar9 = uVar10 + 1;
      uVar10 = (uint)*(ushort *)((long)c->array + lVar8);
      size = size + (uint)(uVar9 != uVar10);
      lVar8 = lVar8 + 2;
    } while ((long)c->cardinality * 2 != lVar8);
  }
  prVar7 = run_container_create_given_capacity(size);
  uVar10 = c->cardinality;
  if ((ulong)uVar10 != 0) {
    if ((int)uVar10 < 1) {
      uVar9 = 0xfffffffe;
      uVar12 = 0xffffffff;
    }
    else {
      puVar3 = c->array;
      uVar12 = 0xffffffff;
      uVar9 = 0xfffffffe;
      uVar11 = 0;
      do {
        uVar1 = puVar3[uVar11];
        if (uVar9 + 1 == (uint)uVar1) {
          uVar5 = (uint)uVar1;
          uVar6 = uVar12;
        }
        else {
          uVar5 = (uint)uVar1;
          uVar6 = (uint)uVar1;
          if (uVar12 != 0xffffffff) {
            prVar4 = prVar7->runs;
            iVar2 = prVar7->n_runs;
            prVar4[iVar2].value = (uint16_t)uVar12;
            prVar4[iVar2].length = (short)uVar9 - (uint16_t)uVar12;
            prVar7->n_runs = iVar2 + 1;
            uVar5 = (uint)puVar3[uVar11];
          }
        }
        uVar12 = uVar6;
        uVar9 = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    prVar4 = prVar7->runs;
    iVar2 = prVar7->n_runs;
    prVar4[iVar2].value = (uint16_t)uVar12;
    prVar4[iVar2].length = (short)uVar9 - (uint16_t)uVar12;
    prVar7->n_runs = iVar2 + 1;
  }
  return prVar7;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}